

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::SyncRepeatedFieldWithMapNoLock(DynamicMapField *this)

{
  long lVar1;
  bool bVar2;
  CppType CVar3;
  FieldDescriptor *pFVar4;
  Arena *pAVar5;
  void *pvVar6;
  RepeatedPtrField<google::protobuf::Message> *pRVar7;
  string *psVar8;
  const_pointer pvVar9;
  Message *pMVar10;
  Message *pMVar11;
  long in_RDI;
  Message *message;
  MapValueRef *map_val;
  MapKey *map_key;
  Message *new_entry;
  const_iterator it;
  FieldDescriptor *val_des;
  FieldDescriptor *key_des;
  Reflection *reflection;
  size_t n;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  Reflection *in_stack_fffffffffffffc50;
  ArenaImpl *in_stack_fffffffffffffc58;
  Arena *in_stack_fffffffffffffc60;
  Reflection *in_stack_fffffffffffffc68;
  ArenaImpl *in_stack_fffffffffffffc70;
  Reflection *in_stack_fffffffffffffc80;
  ArenaImpl *in_stack_fffffffffffffc88;
  Arena *in_stack_fffffffffffffc90;
  Reflection *in_stack_fffffffffffffc98;
  Arena *in_stack_fffffffffffffcc0;
  Reflection *in_stack_fffffffffffffcc8;
  ArenaImpl *in_stack_fffffffffffffcd0;
  Arena *in_stack_fffffffffffffcd8;
  Reflection *in_stack_fffffffffffffce0;
  string local_1b0 [32];
  MapValueRef *local_190;
  string local_148 [32];
  const_pointer local_128;
  ArenaImpl *local_120;
  allocator local_e1;
  string local_e0 [32];
  Arena *local_c0;
  allocator local_a1;
  string local_a0 [32];
  FieldDescriptor *local_80;
  Reflection *local_78;
  long local_68;
  long local_60;
  long local_58;
  long local_40;
  RepeatedPtrField<google::protobuf::Message> *local_38;
  long local_30;
  long local_28;
  size_t local_20;
  byte local_11;
  long local_10;
  void *local_8;
  
  local_78 = Message::GetReflection((Message *)in_stack_fffffffffffffc50);
  Message::GetDescriptor((Message *)in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"key",&local_a1);
  pFVar4 = Descriptor::FindFieldByName
                     ((Descriptor *)in_stack_fffffffffffffc68,(string *)in_stack_fffffffffffffc60);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pFVar4;
  Message::GetDescriptor((Message *)in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"value",&local_e1);
  pAVar5 = (Arena *)Descriptor::FindFieldByName
                              ((Descriptor *)in_stack_fffffffffffffc68,
                               (string *)in_stack_fffffffffffffc60);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  local_c0 = pAVar5;
  if (*(long *)(in_RDI + 0x10) == 0) {
    if (*(long *)(in_RDI + 8) == 0) {
      pvVar6 = operator_new(0x18);
      RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                ((RepeatedPtrField<google::protobuf::Message> *)0x43a1d0);
      *(void **)(in_RDI + 0x10) = pvVar6;
    }
    else {
      lVar1 = *(long *)(in_RDI + 8);
      local_68 = lVar1;
      local_60 = lVar1;
      local_58 = lVar1;
      local_40 = lVar1;
      if (lVar1 == 0) {
        pRVar7 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
        RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                  ((RepeatedPtrField<google::protobuf::Message> *)0x43a30f);
        local_38 = pRVar7;
      }
      else {
        local_11 = 0;
        local_28 = lVar1;
        local_10 = lVar1;
        local_20 = AlignUpTo8(0x18);
        Arena::AllocHook(in_stack_fffffffffffffc60,(type_info *)in_stack_fffffffffffffc58,
                         (size_t)in_stack_fffffffffffffc50);
        if ((local_11 & 1) == 0) {
          local_8 = ArenaImpl::AllocateAlignedAndAddCleanup
                              (in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68,
                               (_func_void_void_ptr *)in_stack_fffffffffffffc60);
        }
        else {
          local_8 = ArenaImpl::AllocateAligned
                              (in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68);
        }
        local_30 = lVar1;
        local_38 = Arena::
                   InternalHelper<google::protobuf::RepeatedPtrField<google::protobuf::Message>>::
                   Construct<google::protobuf::Arena*>
                             (in_stack_fffffffffffffc50,
                              (Arena **)
                              CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      }
      *(RepeatedPtrField<google::protobuf::Message> **)(in_RDI + 0x10) = local_38;
    }
  }
  RepeatedPtrField<google::protobuf::Message>::Clear
            ((RepeatedPtrField<google::protobuf::Message> *)0x43a46b);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
             in_stack_fffffffffffffc80);
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               in_stack_fffffffffffffc80);
    bVar2 = protobuf::operator!=
                      ((const_iterator *)in_stack_fffffffffffffc50,
                       (const_iterator *)
                       CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    if (!bVar2) break;
    local_120 = (ArenaImpl *)(**(code **)(**(long **)(in_RDI + 0x60) + 0x18))();
    RepeatedPtrField<google::protobuf::Message>::AddAllocated
              ((RepeatedPtrField<google::protobuf::Message> *)in_stack_fffffffffffffc50,
               (Message *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    local_128 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
                operator->((const_iterator *)0x43a501);
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x43a516);
    switch(CVar3) {
    case CPPTYPE_INT32:
      MapKey::GetInt32Value((MapKey *)in_stack_fffffffffffffce0);
      Reflection::SetInt32
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,
                 (int32)((ulong)in_stack_fffffffffffffc58 >> 0x20));
      break;
    case CPPTYPE_INT64:
      MapKey::GetInt64Value((MapKey *)in_stack_fffffffffffffce0);
      Reflection::SetInt64
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,(int64)in_stack_fffffffffffffc58);
      break;
    case CPPTYPE_UINT32:
      MapKey::GetUInt32Value((MapKey *)in_stack_fffffffffffffce0);
      Reflection::SetUInt32
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,
                 (uint32)((ulong)in_stack_fffffffffffffc58 >> 0x20));
      break;
    case CPPTYPE_UINT64:
      MapKey::GetUInt64Value((MapKey *)in_stack_fffffffffffffce0);
      Reflection::SetUInt64
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,(uint64)in_stack_fffffffffffffc58);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffc60,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                 (char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffc50,
                 (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffc50,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      LogMessage::~LogMessage((LogMessage *)0x43a84a);
      break;
    case CPPTYPE_BOOL:
      MapKey::GetBoolValue((MapKey *)in_stack_fffffffffffffce0);
      Reflection::SetBool((Reflection *)in_stack_fffffffffffffc70,
                          (Message *)in_stack_fffffffffffffc68,
                          (FieldDescriptor *)in_stack_fffffffffffffc60,
                          SUB81((ulong)in_stack_fffffffffffffc58 >> 0x38,0));
      break;
    case CPPTYPE_STRING:
      psVar8 = MapKey::GetStringValue_abi_cxx11_((MapKey *)in_stack_fffffffffffffce0);
      std::__cxx11::string::string(local_148,(string *)psVar8);
      Reflection::SetString
                ((Reflection *)in_stack_fffffffffffffcd8,(Message *)in_stack_fffffffffffffcd0,
                 (FieldDescriptor *)in_stack_fffffffffffffcc8,(string *)in_stack_fffffffffffffcc0);
      std::__cxx11::string::~string(local_148);
    }
    pvVar9 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
             operator->((const_iterator *)0x43a87f);
    local_190 = &pvVar9->second;
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x43a898);
    switch(CVar3) {
    case CPPTYPE_INT32:
      in_stack_fffffffffffffce0 = local_78;
      MapValueRef::GetInt32Value((MapValueRef *)local_78);
      Reflection::SetInt32
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,
                 (int32)((ulong)in_stack_fffffffffffffc58 >> 0x20));
      break;
    case CPPTYPE_INT64:
      MapValueRef::GetInt64Value((MapValueRef *)in_stack_fffffffffffffce0);
      Reflection::SetInt64
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,(int64)in_stack_fffffffffffffc58);
      break;
    case CPPTYPE_UINT32:
      in_stack_fffffffffffffcc0 = local_c0;
      MapValueRef::GetUInt32Value((MapValueRef *)in_stack_fffffffffffffce0);
      Reflection::SetUInt32
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,
                 (uint32)((ulong)in_stack_fffffffffffffc58 >> 0x20));
      break;
    case CPPTYPE_UINT64:
      in_stack_fffffffffffffcc8 = local_78;
      in_stack_fffffffffffffcd0 = local_120;
      in_stack_fffffffffffffcd8 = local_c0;
      MapValueRef::GetUInt64Value((MapValueRef *)in_stack_fffffffffffffce0);
      Reflection::SetUInt64
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,(uint64)in_stack_fffffffffffffc58);
      break;
    case CPPTYPE_DOUBLE:
      in_stack_fffffffffffffc80 = local_78;
      in_stack_fffffffffffffc88 = local_120;
      in_stack_fffffffffffffc90 = local_c0;
      MapValueRef::GetDoubleValue((MapValueRef *)in_stack_fffffffffffffce0);
      Reflection::SetDouble
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,(double)in_stack_fffffffffffffc58);
      break;
    case CPPTYPE_FLOAT:
      in_stack_fffffffffffffc68 = local_78;
      in_stack_fffffffffffffc70 = local_120;
      MapValueRef::GetFloatValue((MapValueRef *)in_stack_fffffffffffffce0);
      Reflection::SetFloat
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,
                 (float)((ulong)in_stack_fffffffffffffc58 >> 0x20));
      break;
    case CPPTYPE_BOOL:
      in_stack_fffffffffffffc98 = local_78;
      MapValueRef::GetBoolValue((MapValueRef *)in_stack_fffffffffffffce0);
      Reflection::SetBool((Reflection *)in_stack_fffffffffffffc70,
                          (Message *)in_stack_fffffffffffffc68,
                          (FieldDescriptor *)in_stack_fffffffffffffc60,
                          SUB81((ulong)in_stack_fffffffffffffc58 >> 0x38,0));
      break;
    case CPPTYPE_ENUM:
      in_stack_fffffffffffffc50 = local_78;
      in_stack_fffffffffffffc58 = local_120;
      in_stack_fffffffffffffc60 = local_c0;
      MapValueRef::GetEnumValue((MapValueRef *)in_stack_fffffffffffffce0);
      Reflection::SetEnumValue
                ((Reflection *)in_stack_fffffffffffffc70,(Message *)in_stack_fffffffffffffc68,
                 (FieldDescriptor *)in_stack_fffffffffffffc60,
                 (int)((ulong)in_stack_fffffffffffffc58 >> 0x20));
      break;
    case CPPTYPE_STRING:
      psVar8 = MapValueRef::GetStringValue_abi_cxx11_((MapValueRef *)in_stack_fffffffffffffce0);
      std::__cxx11::string::string(local_1b0,(string *)psVar8);
      Reflection::SetString
                ((Reflection *)in_stack_fffffffffffffcd8,(Message *)in_stack_fffffffffffffcd0,
                 (FieldDescriptor *)in_stack_fffffffffffffcc8,(string *)in_stack_fffffffffffffcc0);
      std::__cxx11::string::~string(local_1b0);
      break;
    case CPPTYPE_MESSAGE:
      pMVar10 = MapValueRef::GetMessageValue((MapValueRef *)in_stack_fffffffffffffce0);
      pMVar11 = Reflection::MutableMessage
                          (in_stack_fffffffffffffc98,(Message *)in_stack_fffffffffffffc90,
                           (FieldDescriptor *)in_stack_fffffffffffffc88,
                           (MessageFactory *)in_stack_fffffffffffffc80);
      (*(pMVar11->super_MessageLite)._vptr_MessageLite[0x10])(pMVar11,pMVar10);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator++
              ((const_iterator *)in_stack_fffffffffffffc50);
  }
  return;
}

Assistant:

void DynamicMapField::SyncRepeatedFieldWithMapNoLock() const {
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  if (MapFieldBase::repeated_field_ == NULL) {
    if (MapFieldBase::arena_ == NULL) {
      MapFieldBase::repeated_field_ = new RepeatedPtrField<Message>();
    } else {
      MapFieldBase::repeated_field_ =
          Arena::CreateMessage<RepeatedPtrField<Message> >(
              MapFieldBase::arena_);
    }
  }

  MapFieldBase::repeated_field_->Clear();

  for (Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
       it != map_.end(); ++it) {
    Message* new_entry = default_entry_->New();
    MapFieldBase::repeated_field_->AddAllocated(new_entry);
    const MapKey& map_key = it->first;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, key_des, map_key.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, key_des, map_key.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, key_des, map_key.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, key_des, map_key.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, key_des, map_key.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, key_des, map_key.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }
    const MapValueRef& map_val = it->second;
    switch (val_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, val_des, map_val.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, val_des, map_val.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, val_des, map_val.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, val_des, map_val.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, val_des, map_val.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, val_des, map_val.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
        reflection->SetDouble(new_entry, val_des, map_val.GetDoubleValue());
        break;
      case FieldDescriptor::CPPTYPE_FLOAT:
        reflection->SetFloat(new_entry, val_des, map_val.GetFloatValue());
        break;
      case FieldDescriptor::CPPTYPE_ENUM:
        reflection->SetEnumValue(new_entry, val_des, map_val.GetEnumValue());
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = map_val.GetMessageValue();
        reflection->MutableMessage(new_entry, val_des)->CopyFrom(message);
        break;
      }
    }
  }
}